

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O0

void __thiscall
lexer_exception::lexer_exception(lexer_exception *this,LexerPosition *position,string *msg)

{
  int iVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [8];
  stringstream buffer;
  ostream local_1a8 [392];
  string *local_20;
  string *msg_local;
  LexerPosition *position_local;
  lexer_exception *this_local;
  
  local_20 = msg;
  msg_local = (string *)position;
  position_local = (LexerPosition *)this;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__lexer_exception_001e8988;
  LexerPosition::LexerPosition(&this->position_,(LexerPosition *)msg_local);
  std::__cxx11::string::string((string *)&this->msg_,(string *)local_20);
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar2 = std::operator<<(local_1a8,anon_var_dwarf_6e588 + 9);
  iVar1 = Position::row(&(this->position_).super_Position);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,anon_var_dwarf_3272d);
  iVar1 = Position::col(&(this->position_).super_Position);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2,anon_var_dwarf_32746);
  std::__cxx11::stringstream::str();
  std::operator+(&local_1d8,&local_1f8,&this->msg_);
  std::__cxx11::string::operator=((string *)&this->msg_,(string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

explicit lexer_exception(const LexerPosition &position, const std::string &msg) : position_(position), msg_(msg) {
        std::stringstream buffer;
        buffer << "第 " << position_.row() << " 行 第 " << position_.col() << " 列: ";
        msg_ = buffer.str() + msg_;
    }